

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

iterator * __thiscall
google::
dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::insert_at<std::pair<int_const,int>const&>
          (iterator *__return_storage_ptr__,
          dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          *this,size_type pos,pair<const_int,_int> *args)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  length_error *this_00;
  
  lVar3 = *(long *)(this + 0x48);
  if (*(long *)(this + 0x50) - lVar3 == -1) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_00,"insert overflow");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  if (lVar3 != 0) {
    iVar2 = *(int *)(this + 0x38);
    iVar1 = *(int *)(*(long *)(this + 0x70) + pos * 8);
    *(int *)(this + 0x38) = iVar2 + 1;
    if (*(int *)(this + 0x3c) == iVar1) {
      *(int *)(this + 0x38) = iVar2 + 2;
      *(long *)(this + 0x48) = lVar3 + -1;
      goto LAB_0062cd28;
    }
  }
  *(long *)(this + 0x50) = *(long *)(this + 0x50) + 1;
LAB_0062cd28:
  *(pair<const_int,_int> *)(*(long *)(this + 0x70) + pos * 8) = *args;
  lVar3 = *(long *)(this + 0x58);
  lVar4 = *(long *)(this + 0x70);
  __return_storage_ptr__->ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)this;
  __return_storage_ptr__->pos = (pointer)(lVar4 + pos * 8);
  __return_storage_ptr__->end = (pointer)(lVar4 + lVar3 * 8);
  return __return_storage_ptr__;
}

Assistant:

size_type size() const { return num_elements - num_deleted; }